

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O0

Page * __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FindPageToSplit(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
               BucketId targetBucket,bool findPreReservedHeapPages)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DListNodeBase<Memory::CustomHeap::Page> *node;
  Page *pPVar4;
  Page *page;
  Page *pageInBucket;
  EditingIterator bucketIter;
  BucketId b;
  bool findPreReservedHeapPages_local;
  BucketId targetBucket_local;
  Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  bucketIter.super_Iterator.current._4_4_ = targetBucket + Bucket256;
  do {
    if (6 < (int)bucketIter.super_Iterator.current._4_4_) {
      return (Page *)0x0;
    }
    DListBase<Memory::CustomHeap::Page,_RealCount>::EditingIterator::EditingIterator
              ((EditingIterator *)&pageInBucket,
               this->buckets + (int)bucketIter.super_Iterator.current._4_4_);
    while( true ) {
      if (bucketIter.super_Iterator.list == (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pPVar4 = pageInBucket;
      node = DListNodeBase<Memory::CustomHeap::Page>::Next
                       (&(bucketIter.super_Iterator.list)->
                         super_DListNodeBase<Memory::CustomHeap::Page>);
      bVar2 = DListBase<Memory::CustomHeap::Page,_RealCount>::IsHead
                        ((DListBase<Memory::CustomHeap::Page,_RealCount> *)pPVar4,node);
      if (bVar2) break;
      bucketIter.super_Iterator.list =
           (DListBase<Memory::CustomHeap::Page,_RealCount> *)
           DListNodeBase<Memory::CustomHeap::Page>::Next
                     (&(bucketIter.super_Iterator.list)->
                       super_DListNodeBase<Memory::CustomHeap::Page>);
      pPVar4 = DListBase<Memory::CustomHeap::Page,_RealCount>::Iterator::Data
                         ((Iterator *)&pageInBucket);
      if ((pPVar4->inFullList & 1U) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                           ,0x307,"(!pageInBucket.inFullList)","!pageInBucket.inFullList");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      if (((!findPreReservedHeapPages) ||
          (bVar2 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                   ::IsPreReservedSegment(this->codePageAllocators,pPVar4->segment), bVar2)) &&
         (bVar2 = Page::CanAllocate(pPVar4,targetBucket), bVar2)) {
        if ((findPreReservedHeapPages) && ((DAT_01ec73ca & 1) != 0)) {
          Output::Trace(CustomHeapPhase,
                        L"PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n");
        }
        if ((DAT_01ec73ca & 1) != 0) {
          Output::Trace(CustomHeapPhase,L"Found page to split. Moving from bucket %d to %d\n",
                        (ulong)bucketIter.super_Iterator.current._4_4_);
        }
        pPVar4 = AddPageToBucket(this,pPVar4,targetBucket,false);
        return pPVar4;
      }
    }
    bucketIter.super_Iterator.list = (DListBase<Memory::CustomHeap::Page,_RealCount> *)0x0;
    bucketIter.super_Iterator.current._4_4_ = bucketIter.super_Iterator.current._4_4_ + 1;
  } while( true );
}

Assistant:

Page* Heap<TAlloc, TPreReservedAlloc>::FindPageToSplit(BucketId targetBucket, bool findPreReservedHeapPages)
{
    for (BucketId b = (BucketId)(targetBucket + 1); b < BucketId::NumBuckets; b = (BucketId) (b + 1))
    {
        #pragma prefast(suppress: __WARNING_UNCHECKED_LOWER_BOUND_FOR_ENUMINDEX, "targetBucket is always in range >= SmallObjectList, but an __in_range doesn't fix the warning.");
        FOREACH_DLISTBASE_ENTRY_EDITING(Page, pageInBucket, &this->buckets[b], bucketIter)
        {
            Assert(!pageInBucket.inFullList);
            if (findPreReservedHeapPages && !this->codePageAllocators->IsPreReservedSegment(pageInBucket.segment))
            {
                //Find only pages that are pre-reserved using preReservedHeapPageAllocator
                continue;
            }

            if (pageInBucket.CanAllocate(targetBucket))
            {
                Page* page = &pageInBucket;
                if (findPreReservedHeapPages)
                {
                    VerboseHeapTrace(_u("PRE-RESERVE: Found page for splitting in Pre Reserved Segment\n"));
                }
                VerboseHeapTrace(_u("Found page to split. Moving from bucket %d to %d\n"), b, targetBucket);
                return AddPageToBucket(page, targetBucket);
            }
        }
        NEXT_DLISTBASE_ENTRY_EDITING;
    }

    return nullptr;
}